

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddMove(DdManager *dd,DdNode *bF,int nVars)

{
  DdNode *local_38;
  DdNode *bVars;
  DdNode *res;
  int nVars_local;
  DdNode *bF_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)bF;
  if ((nVars != 0) && (*(int *)((ulong)bF & 0xfffffffffffffffe) != 0x7fffffff)) {
    if (dd->size < nVars) {
      __assert_fail("nVars <= dd->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                    ,0xc6,"DdNode *Extra_bddMove(DdManager *, DdNode *, int)");
    }
    if (nVars < 1) {
      local_38 = (DdNode *)((ulong)dd->vars[-nVars] ^ 1);
    }
    else {
      local_38 = dd->vars[nVars];
    }
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)extraBddMove(dd,bF,local_38);
    } while (dd->reordered == 1);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Extra_bddMove( 
  DdManager * dd,   /* the DD manager */
  DdNode * bF,
  int nVars) 
{
    DdNode * res;
    DdNode * bVars;
    if ( nVars == 0 )
        return bF;
    if ( Cudd_IsConstant(bF) )
        return bF;
    assert( nVars <= dd->size );
    if ( nVars > 0 )
        bVars = dd->vars[nVars];
    else
        bVars = Cudd_Not(dd->vars[-nVars]);

    do {
        dd->reordered = 0;
        res = extraBddMove( dd, bF, bVars );
    } while (dd->reordered == 1);
    return(res);

}